

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O2

void __thiscall
libcellml::Validator::ValidatorImpl::handleErrorsFromImports
          (ValidatorImpl *this,size_t initialErrorCount,bool isOriginatingModel,string *type,
          string *name,History *history,ComponentPtr *component,UnitsPtr *units)

{
  AnyCellmlElementImpl *this_00;
  IssueImpl *pIVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  ostream *poVar6;
  undefined7 in_register_00000011;
  ulong uVar7;
  char *pcVar8;
  allocator<char> local_269;
  ValidatorImpl *local_268;
  string *local_260;
  undefined4 local_254;
  IssuePtr issue;
  value_type h;
  Strings ss;
  string importInfo;
  string description;
  ostringstream os;
  
  local_254 = (undefined4)CONCAT71(in_register_00000011,isOriginatingModel);
  local_268 = this;
  local_260 = type;
  if (handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
      ::skipThis_abi_cxx11_ == '\0') {
    iVar3 = __cxa_guard_acquire(&handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                                 ::skipThis_abi_cxx11_);
    if (iVar3 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                  ::skipThis_abi_cxx11_,"Cyclic dependencies",(allocator<char> *)&os);
      __cxa_atexit(std::__cxx11::string::~string,
                   &handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                    ::skipThis_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                           ::skipThis_abi_cxx11_);
      this = local_268;
    }
  }
  if (handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
      ::notOriginMarker_abi_cxx11_ == '\0') {
    iVar3 = __cxa_guard_acquire(&handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                                 ::notOriginMarker_abi_cxx11_);
    if (iVar3 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                  ::notOriginMarker_abi_cxx11_,"NOT ORIGIN: ",(allocator<char> *)&os);
      __cxa_atexit(std::__cxx11::string::~string,
                   &handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                    ::notOriginMarker_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                           ::notOriginMarker_abi_cxx11_);
      this = local_268;
    }
  }
  if (handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
      ::dataBoundaryMarker_abi_cxx11_ == '\0') {
    iVar3 = __cxa_guard_acquire(&handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                                 ::dataBoundaryMarker_abi_cxx11_);
    if (iVar3 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                  ::dataBoundaryMarker_abi_cxx11_,"&",(allocator<char> *)&os);
      __cxa_atexit(std::__cxx11::string::~string,
                   &handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                    ::dataBoundaryMarker_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                           ::dataBoundaryMarker_abi_cxx11_);
      this = local_268;
    }
  }
  if (handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
      ::dataSeparator_abi_cxx11_ == '\0') {
    iVar3 = __cxa_guard_acquire(&handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                                 ::dataSeparator_abi_cxx11_);
    if (iVar3 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                  ::dataSeparator_abi_cxx11_,";",(allocator<char> *)&os);
      __cxa_atexit(std::__cxx11::string::~string,
                   &handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                    ::dataSeparator_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                           ::dataSeparator_abi_cxx11_);
      this = local_268;
    }
  }
  while( true ) {
    sVar4 = Logger::issueCount(&this->mValidator->super_Logger);
    if (sVar4 <= initialErrorCount) break;
    Logger::issue((Logger *)&issue,(size_t)this->mValidator);
    Issue::description_abi_cxx11_
              (&description,
               issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    std::__cxx11::string::substr((ulong)&os,(ulong)&description);
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&os
                            ,&handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                              ::skipThis_abi_cxx11_);
    std::__cxx11::string::~string((string *)&os);
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
      if ((char)local_254 == '\0') {
        std::__shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&h.super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>,
                   &(history->
                    super__Vector_base<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish[-1].
                    super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>);
        poVar6 = std::operator<<((ostream *)&os,
                                 (string *)
                                 &handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                                  ::notOriginMarker_abi_cxx11_);
        poVar6 = std::operator<<(poVar6,(string *)
                                        &handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                                         ::dataBoundaryMarker_abi_cxx11_);
        poVar6 = std::operator<<(poVar6,(string *)
                                        &(h.
                                          super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->mName);
        poVar6 = std::operator<<(poVar6,(string *)
                                        &handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                                         ::dataSeparator_abi_cxx11_);
        poVar6 = std::operator<<(poVar6,(string *)
                                        &(h.
                                          super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->mReferenceName);
        poVar6 = std::operator<<(poVar6,(string *)
                                        &handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                                         ::dataSeparator_abi_cxx11_);
        poVar6 = std::operator<<(poVar6,(string *)
                                        &(h.
                                          super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->mDestinationUrl);
        poVar6 = std::operator<<(poVar6,(string *)
                                        &handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                                         ::dataBoundaryMarker_abi_cxx11_);
        std::operator<<(poVar6,(string *)&description);
        pIVar1 = (issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 mPimpl;
        std::__cxx11::stringbuf::str();
        Issue::IssueImpl::setDescription(pIVar1,&importInfo);
        std::__cxx11::string::~string((string *)&importInfo);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&h.super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      else {
        lVar5 = std::__cxx11::string::find((string *)&description,0x2a5e68);
        uVar7 = 1;
        while( true ) {
          this = local_268;
          if (lVar5 == -1) break;
          if (uVar7 == 1) {
            std::operator<<((ostream *)&os,"Imported ");
            bVar2 = std::operator==(local_260,"Component");
            pcVar8 = "units ";
            if (bVar2) {
              pcVar8 = "component ";
            }
            std::operator<<((ostream *)&os,pcVar8);
            poVar6 = std::operator<<((ostream *)&os,"\'");
            poVar6 = std::operator<<(poVar6,(string *)name);
            poVar6 = std::operator<<(poVar6,"\' is not valid because:");
            std::endl<char,std::char_traits<char>>(poVar6);
          }
          std::__cxx11::string::find((string *)&description,0x2a5e90);
          std::__cxx11::string::find((string *)&description,0x2a5e90);
          std::__cxx11::string::substr((ulong)&importInfo,(ulong)&description);
          std::__cxx11::string::string<std::allocator<char>>((string *)&h,";",&local_269);
          split(&ss,&importInfo,(string *)&h);
          std::__cxx11::string::~string((string *)&h);
          poVar6 = std::operator<<((ostream *)&os,"  -> ");
          poVar6 = std::operator<<(poVar6,(string *)local_260);
          poVar6 = std::operator<<(poVar6," \'");
          poVar6 = std::operator<<(poVar6,(string *)
                                          ss.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
          poVar6 = std::operator<<(poVar6,"\' importing \'");
          poVar6 = std::operator<<(poVar6,(string *)
                                          (ss.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + 1));
          poVar6 = std::operator<<(poVar6,"\' from \'");
          poVar6 = std::operator<<(poVar6,(string *)
                                          (ss.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + 2));
          std::operator<<(poVar6,"\'");
          lVar5 = std::__cxx11::string::find((string *)&description,0x2a5e68);
          if (lVar5 == -1) {
            if (1 < uVar7) {
              std::operator<<((ostream *)&os," which");
            }
            poVar6 = std::operator<<((ostream *)&os," has an error:");
            poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
            std::operator<<(poVar6,"   - ");
          }
          else {
            poVar6 = std::operator<<((ostream *)&os," imports:");
            std::endl<char,std::char_traits<char>>(poVar6);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&ss);
          std::__cxx11::string::~string((string *)&importInfo);
          uVar7 = uVar7 + 1;
        }
        if (uVar7 != 1) {
          bVar2 = std::operator==(local_260,"Component");
          this_00 = (((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      )->mPimpl->mItem).
                     super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->mPimpl;
          if (bVar2) {
            AnyCellmlElement::AnyCellmlElementImpl::setComponent(this_00,component,COMPONENT);
          }
          else {
            AnyCellmlElement::AnyCellmlElementImpl::setUnits(this_00,units);
          }
        }
        std::__cxx11::string::substr((ulong)&importInfo,(ulong)&description);
        std::operator<<((ostream *)&os,(string *)&importInfo);
        std::__cxx11::string::~string((string *)&importInfo);
        pIVar1 = (issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 mPimpl;
        std::__cxx11::stringbuf::str();
        Issue::IssueImpl::setDescription(pIVar1,&importInfo);
        std::__cxx11::string::~string((string *)&importInfo);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
    }
    std::__cxx11::string::~string((string *)&description);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    initialErrorCount = initialErrorCount + 1;
  }
  return;
}

Assistant:

void Validator::ValidatorImpl::handleErrorsFromImports(size_t initialErrorCount, bool isOriginatingModel, const std::string &type, const std::string &name, const History &history, const ComponentPtr &component, const UnitsPtr &units) const
{
    static const std::string skipThis = "Cyclic dependencies";
    static const std::string notOriginMarker = "NOT ORIGIN: ";
    static const std::string dataBoundaryMarker = "&";
    static const std::string dataSeparator = ";";

    for (size_t i = initialErrorCount; i < mValidator->issueCount(); ++i) {
        auto issue = mValidator->issue(i);
        auto description = issue->description();
        if (description.substr(0, skipThis.length()) != skipThis) {
            std::ostringstream os;
            if (isOriginatingModel) {
                // If error is not from this model then set this component or units.
                size_t depth = 0;
                size_t pos = description.find(notOriginMarker);
                size_t originalDescriptionStart = 0;
                while (pos != std::string::npos) {
                    if (depth == 0) {
                        os << "Imported ";
                        if (type == "Component") {
                            os << "component ";
                        } else {
                            os << "units ";
                        }
                        os << "'" << name << "' is not valid because:" << std::endl;
                    }
                    size_t startMarker = description.find(dataBoundaryMarker, pos);
                    size_t endMarker = description.find(dataBoundaryMarker, startMarker + 1);
                    std::string importInfo = description.substr(startMarker + 1, endMarker - startMarker - 1);
                    auto ss = split(importInfo);
                    os << "  -> " << type << " '" << ss[0] << "' importing '" << ss[1] << "' from '" << ss[2] << "'";
                    originalDescriptionStart = endMarker + 1;
                    pos = description.find(notOriginMarker, pos + 1);
                    depth += 1;
                    if (pos == std::string::npos) {
                        if (depth > 1) {
                            os << " which";
                        }
                        os << " has an error:" << std::endl
                           << "   - ";
                    } else {
                        os << " imports:" << std::endl;
                    }
                }

                if (depth > 0) {
                    if (type == "Component") {
                        issue->mPimpl->mItem->mPimpl->setComponent(component);
                    } else {
                        issue->mPimpl->mItem->mPimpl->setUnits(units);
                    }
                }

                os << description.substr(originalDescriptionStart);
                issue->mPimpl->setDescription(os.str());
            } else {
                // Get name, reference, and import source from history.
                auto h = history.back();
                os << notOriginMarker << dataBoundaryMarker << h->mName << dataSeparator << h->mReferenceName << dataSeparator << h->mDestinationUrl << dataBoundaryMarker << description;
                issue->mPimpl->setDescription(os.str());
            }
        }
    }
}